

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void disas_simd_shift_imm(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *pTVar1;
  MemOp memop;
  uint rd;
  MemOp memop_00;
  TCGv_i64 pTVar3;
  TCGv_i64 pTVar4;
  TCGTemp *pTVar5;
  TCGTemp *pTVar6;
  TCGTemp *pTVar7;
  long shift;
  byte bVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  uintptr_t o_2;
  undefined1 is_q;
  uint uVar12;
  uint64_t pc;
  TCGContext_conflict1 *pTVar13;
  bool bVar14;
  uint32_t uVar15;
  uint immb;
  uint rn;
  uintptr_t o_3;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uintptr_t o_1;
  TCGv_i64 pTVar19;
  _Bool _Var20;
  GVecGen2i_conflict1 *pGVar21;
  uint local_80;
  TCGv_i64 local_60;
  uint local_40;
  ulong uVar2;
  
  uVar16 = insn >> 0x13 & 0xf;
  if (uVar16 == 0) {
    __assert_fail("immh != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x29a6,"void disas_simd_shift_imm(DisasContext *, uint32_t)");
  }
  uVar11 = insn >> 0xb & 0x1f;
  if (0x1f < uVar11) goto switchD_006aabd3_caseD_1;
  rd = insn & 0x1f;
  uVar2 = (ulong)rd;
  rn = insn >> 5 & 0x1f;
  immb = insn >> 0x10 & 7;
  uVar17 = insn & 0x20000000;
  uVar12 = insn & 0x40000000;
  switch(uVar11) {
  case 0:
  case 2:
  case 4:
  case 6:
    goto switchD_006aabd3_caseD_0;
  default:
    goto switchD_006aabd3_caseD_1;
  case 8:
    if (uVar17 == 0) goto switchD_006aabd3_caseD_1;
switchD_006aabd3_caseD_0:
    local_80 = insn & 0x20000000;
    pTVar13 = s->uc->tcg_ctx;
    memop = MO_ALIGN_2|MO_BESL|MO_16;
    if (uVar16 != 0) {
      for (; uVar16 >> memop == 0; memop = memop - MO_16) {
      }
    }
    bVar8 = (byte)memop;
    iVar10 = 8 << (bVar8 & 0x1f);
    pTVar3 = new_tmp_a64_aarch64(s);
    pTVar4 = new_tmp_a64_aarch64(s);
    if ((insn & 0x40400000) == 0x400000) {
switchD_006aabd3_caseD_1:
      unallocated_encoding_aarch64(s);
      return;
    }
    if (s->fp_access_checked == true) {
LAB_006ab6d7:
      __assert_fail("!s->fp_access_checked",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                    ,0x487,"_Bool fp_access_check(DisasContext *)");
    }
    s->fp_access_checked = true;
    uVar15 = s->fp_excp_el;
    if (uVar15 != 0) {
      pc = s->pc_curr;
      goto LAB_006ab0a0;
    }
    if (8 < uVar11) {
switchD_006ab10b_caseD_1:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                 ,0x2900,(char *)0x0);
    }
    iVar18 = (0x10 << (bVar8 & 0x1f)) - (immb + uVar16 * 8);
    rd = (uint)uVar2;
    switch(uVar11) {
    case 0:
      if (local_80 == 0) {
        tcg_gen_gvec_sari_aarch64
                  (s->uc->tcg_ctx,memop,rd * 0x100 + 0xc10,rn * 0x100 + 0xc10,
                   (long)(int)(iVar18 - (uint)(iVar18 == iVar10)),(uint)(uVar12 != 0) * 8 + 8,
                   s->sve_len);
        return;
      }
      if (iVar18 != iVar10) {
        tcg_gen_gvec_shri_aarch64
                  (s->uc->tcg_ctx,memop,rd * 0x100 + 0xc10,rn * 0x100 + 0xc10,(long)iVar18,
                   (uint)(uVar12 != 0) * 8 + 8,s->sve_len);
        return;
      }
      tcg_gen_gvec_dup8i_aarch64
                (pTVar13,rd * 0x100 + 0xc10,(uint)(uVar12 != 0) * 8 + 8,s->sve_len,'\0');
      return;
    default:
      goto switchD_006ab10b_caseD_1;
    case 2:
      if (local_80 == 0) {
        shift = (long)(int)(iVar18 - (uint)(iVar18 == iVar10));
        pGVar21 = ssra_op_aarch64 + memop;
        uVar15 = s->sve_len;
        pTVar13 = s->uc->tcg_ctx;
        goto LAB_006ab5f9;
      }
      if (iVar18 == iVar10) goto LAB_006ab329;
      pGVar21 = usra_op_aarch64;
LAB_006ab37e:
      pGVar21 = pGVar21 + memop;
      shift = (long)iVar18;
      uVar15 = s->sve_len;
      pTVar13 = s->uc->tcg_ctx;
LAB_006ab5f9:
      tcg_gen_gvec_2i_aarch64
                (pTVar13,rd * 0x100 + 0xc10,rn * 0x100 + 0xc10,(uint)(uVar12 != 0) * 8 + 8,uVar15,
                 shift,pGVar21);
      return;
    case 4:
      _Var20 = false;
      break;
    case 6:
      _Var20 = true;
      break;
    case 8:
      if (iVar18 != iVar10) {
        pGVar21 = sri_op_aarch64;
        goto LAB_006ab37e;
      }
      goto LAB_006ab329;
    }
    memop_00 = local_80 >> 0x1b ^ MO_ASHIFT | memop;
    pTVar19 = tcg_const_i64_aarch64(pTVar13,1L << ((char)iVar18 - 1U & 0x3f));
    uVar16 = 0;
    do {
      read_vec_element((DisasContext_conflict1 *)s->uc->tcg_ctx,pTVar3,rn,uVar16,memop_00);
      if (_Var20 != false) {
        read_vec_element((DisasContext_conflict1 *)s->uc->tcg_ctx,pTVar4,(int)uVar2,uVar16,memop_00)
        ;
      }
      handle_shri_with_rndacc(pTVar13,pTVar4,pTVar3,pTVar19,_Var20,local_80 != 0,memop,iVar18);
      write_vec_element((DisasContext_conflict1 *)s->uc->tcg_ctx,pTVar4,(int)uVar2,uVar16,memop);
      uVar16 = uVar16 + 1;
    } while ((uint)(uVar12 != 0) * 0x40 + 0x40 >> (0x22 - (bVar8 ^ 0x1f) & 0x1f) != uVar16);
    tcg_temp_free_internal_aarch64(pTVar13,(TCGTemp *)(pTVar19 + (long)pTVar13));
LAB_006ab329:
    uVar16 = s->sve_len;
    is_q = SUB81(s->uc->tcg_ctx,0);
LAB_006ab53a:
    clear_vec_high((DisasContext_conflict1 *)(ulong)uVar16,(_Bool)is_q,(uint)(uVar12 != 0));
    return;
  case 10:
    uVar11 = 0x1f;
    if (uVar16 != 0) {
      for (; uVar16 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    if ((insn & 0x40400000) == 0x400000) goto switchD_006aabd3_caseD_1;
    if (s->fp_access_checked == true) goto LAB_006ab6d7;
    s->fp_access_checked = true;
    uVar15 = s->fp_excp_el;
    if (uVar15 == 0) {
      shift = (long)(int)(immb + uVar16 * 8 + (-8 << ((byte)uVar11 & 0x1f)));
      if (uVar17 == 0) {
        tcg_gen_gvec_shli_aarch64
                  (s->uc->tcg_ctx,uVar11,rd * 0x100 + 0xc10,rn * 0x100 + 0xc10,shift,
                   (uint)(uVar12 != 0) * 8 + 8,s->sve_len);
        return;
      }
      pGVar21 = sli_op_aarch64 + uVar11;
      uVar15 = s->sve_len;
      pTVar13 = s->uc->tcg_ctx;
      goto LAB_006ab5f9;
    }
    goto LAB_006ab09c;
  case 0xc:
    if (uVar17 == 0) goto switchD_006aabd3_caseD_1;
    _Var20 = false;
    bVar14 = true;
    goto LAB_006aaecb;
  case 0xe:
    _Var20 = uVar17 != 0;
    bVar14 = _Var20;
LAB_006aaecb:
    handle_simd_qshl(s,false,uVar12 != 0,_Var20,bVar14,uVar16,immb,rn,rd);
    break;
  case 0x10:
  case 0x11:
    if (uVar17 != 0) {
      _Var20 = false;
      bVar14 = true;
      goto LAB_006aacdd;
    }
    local_40 = 0x1f;
    if (uVar16 != 0) {
      for (; uVar16 >> local_40 == 0; local_40 = local_40 - 1) {
      }
    }
    bVar8 = (byte)local_40;
    bVar9 = 0x22 - (bVar8 ^ 0x1f);
    if ((insn >> 0x16 & 1) != 0) goto switchD_006aabd3_caseD_1;
    if (s->fp_access_checked == true) goto LAB_006ab6d7;
    pTVar13 = s->uc->tcg_ctx;
    s->fp_access_checked = true;
    uVar15 = s->fp_excp_el;
    if (uVar15 == 0) {
      local_40 = local_40 ^ 0x1f;
      iVar18 = (0x10 << (bVar8 & 0x1f)) - (immb + uVar16 * 8);
      uVar16 = 0;
      pTVar5 = tcg_temp_new_internal_aarch64(pTVar13,TCG_TYPE_I64,false);
      pTVar6 = tcg_temp_new_internal_aarch64(pTVar13,TCG_TYPE_I64,false);
      pTVar7 = tcg_temp_new_internal_aarch64(pTVar13,TCG_TYPE_I64,false);
      pTVar3 = (TCGv_i64)((long)pTVar7 - (long)pTVar13);
      pTVar1 = s->uc->tcg_ctx;
      iVar10 = rd * 0x100;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,(TCGArg)((long)pTVar1 + (long)pTVar3),
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),
                          (ulong)(iVar10 + (uVar12 >> 0x1b) + 0xc10));
      if ((insn >> 0xb & 1) == 0) {
        local_60 = (TCGv_i64)0x0;
      }
      else {
        local_60 = tcg_const_i64_aarch64(pTVar13,1L << ((char)iVar18 - 1U & 0x3f));
      }
      pTVar19 = (TCGv_i64)((long)pTVar5 - (long)pTVar13);
      pTVar4 = (TCGv_i64)((long)pTVar6 - (long)pTVar13);
      do {
        read_vec_element((DisasContext_conflict1 *)s->uc->tcg_ctx,pTVar19,rn,uVar16,
                         MO_ALIGN_4 - local_40);
        handle_shri_with_rndacc
                  (pTVar13,pTVar4,pTVar19,local_60,false,true,MO_ALIGN_4 - local_40,iVar18);
        tcg_gen_deposit_i64_aarch64
                  (pTVar13,pTVar3,pTVar3,pTVar4,uVar16 << (bVar9 & 0x1f),8 << (bVar8 & 0x1f));
        uVar16 = uVar16 + 1;
      } while (0x40U >> (bVar9 & 0x1f) != uVar16);
      uVar16 = iVar10 + 0xc10;
      if (uVar12 != 0) {
        uVar16 = iVar10 + 0xc18;
      }
      pTVar1 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_st_i64,(TCGArg)((long)pTVar1 + (long)pTVar3),
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),(ulong)uVar16);
      if ((insn >> 0xb & 1) != 0) {
        tcg_temp_free_internal_aarch64(pTVar13,(TCGTemp *)(local_60 + (long)pTVar13));
      }
      tcg_temp_free_internal_aarch64(pTVar13,(TCGTemp *)(pTVar19 + (long)pTVar13));
      tcg_temp_free_internal_aarch64(pTVar13,(TCGTemp *)(pTVar4 + (long)pTVar13));
      tcg_temp_free_internal_aarch64(pTVar13,(TCGTemp *)(pTVar3 + (long)pTVar13));
      uVar16 = s->sve_len;
      is_q = SUB81(s->uc->tcg_ctx,0);
      goto LAB_006ab53a;
    }
    goto LAB_006ab09c;
  case 0x12:
  case 0x13:
    _Var20 = uVar17 != 0;
    bVar14 = _Var20;
LAB_006aacdd:
    handle_vec_simd_sqshrn(s,false,uVar12 != 0,_Var20,bVar14,uVar16,immb,uVar11,rn,rd);
    break;
  case 0x14:
    local_80 = insn & 0x20000000;
    pTVar13 = s->uc->tcg_ctx;
    uVar11 = 0x1f;
    if (uVar16 != 0) {
      for (; uVar16 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    bVar8 = 0x22 - (char)(uVar11 ^ 0x1f);
    pTVar3 = new_tmp_a64_aarch64(s);
    pTVar4 = new_tmp_a64_aarch64(s);
    if (7 < uVar16) goto switchD_006aabd3_caseD_1;
    if (s->fp_access_checked == true) goto LAB_006ab6d7;
    s->fp_access_checked = true;
    uVar15 = s->fp_excp_el;
    if (uVar15 == 0) {
      pTVar1 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar1,INDEX_op_ld_i64,(TCGArg)(pTVar3 + (long)pTVar1),
                          (TCGArg)(pTVar1->cpu_env + (long)pTVar1),
                          (ulong)(rn * 0x100 + (uVar12 >> 0x1b) + 0xc10));
      uVar12 = 0;
      do {
        tcg_gen_shri_i64_aarch64(pTVar13,pTVar4,pTVar3,(long)(int)(uVar12 << (bVar8 & 0x1f)));
        ext_and_shift_reg(pTVar13,pTVar4,pTVar4,uVar11 | local_80 >> 0x1b ^ 4,0);
        tcg_gen_shli_i64_aarch64
                  (pTVar13,pTVar4,pTVar4,
                   (long)(int)(immb + uVar16 * 8 + (-8 << ((byte)uVar11 & 0x1f))));
        write_vec_element((DisasContext_conflict1 *)s->uc->tcg_ctx,pTVar4,rd,uVar12,
                          MO_ALIGN_4 - (uVar11 ^ 0x1f));
        uVar12 = uVar12 + 1;
      } while (0x40U >> (bVar8 & 0x1f) != uVar12);
      return;
    }
LAB_006ab09c:
    pc = s->pc_curr;
LAB_006ab0a0:
    gen_exception_insn(s,pc,1,0x1fe0000a,uVar15);
    return;
  case 0x1c:
    handle_simd_shift_intfp_conv(s,false,uVar12 != 0,uVar17 != 0,uVar16,immb,rn,rd,rd);
    break;
  case 0x1f:
    handle_simd_shift_fpint_conv(s,false,uVar12 != 0,uVar17 != 0,uVar16,immb,rn,rd);
  }
  return;
}

Assistant:

static void disas_simd_shift_imm(DisasContext *s, uint32_t insn)
{
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int opcode = extract32(insn, 11, 5);
    int immb = extract32(insn, 16, 3);
    int immh = extract32(insn, 19, 4);
    bool is_u = extract32(insn, 29, 1);
    bool is_q = extract32(insn, 30, 1);

    /* data_proc_simd[] has sent immh == 0 to disas_simd_mod_imm. */
    assert(immh != 0);

    switch (opcode) {
    case 0x08: /* SRI */
        if (!is_u) {
            unallocated_encoding(s);
            return;
        }
        /* fall through */
    case 0x00: /* SSHR / USHR */
    case 0x02: /* SSRA / USRA (accumulate) */
    case 0x04: /* SRSHR / URSHR (rounding) */
    case 0x06: /* SRSRA / URSRA (accum + rounding) */
        handle_vec_simd_shri(s, is_q, is_u, immh, immb, opcode, rn, rd);
        break;
    case 0x0a: /* SHL / SLI */
        handle_vec_simd_shli(s, is_q, is_u, immh, immb, opcode, rn, rd);
        break;
    case 0x10: /* SHRN */
    case 0x11: /* RSHRN / SQRSHRUN */
        if (is_u) {
            handle_vec_simd_sqshrn(s, false, is_q, false, true, immh, immb,
                                   opcode, rn, rd);
        } else {
            handle_vec_simd_shrn(s, is_q, immh, immb, opcode, rn, rd);
        }
        break;
    case 0x12: /* SQSHRN / UQSHRN */
    case 0x13: /* SQRSHRN / UQRSHRN */
        handle_vec_simd_sqshrn(s, false, is_q, is_u, is_u, immh, immb,
                               opcode, rn, rd);
        break;
    case 0x14: /* SSHLL / USHLL */
        handle_vec_simd_wshli(s, is_q, is_u, immh, immb, opcode, rn, rd);
        break;
    case 0x1c: /* SCVTF / UCVTF */
        handle_simd_shift_intfp_conv(s, false, is_q, is_u, immh, immb,
                                     opcode, rn, rd);
        break;
    case 0xc: /* SQSHLU */
        if (!is_u) {
            unallocated_encoding(s);
            return;
        }
        handle_simd_qshl(s, false, is_q, false, true, immh, immb, rn, rd);
        break;
    case 0xe: /* SQSHL, UQSHL */
        handle_simd_qshl(s, false, is_q, is_u, is_u, immh, immb, rn, rd);
        break;
    case 0x1f: /* FCVTZS/ FCVTZU */
        handle_simd_shift_fpint_conv(s, false, is_q, is_u, immh, immb, rn, rd);
        return;
    default:
        unallocated_encoding(s);
        return;
    }
}